

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkCSweep(Abc_Ntk_t *pNtk,int nCutsMax,int nLeafMax,int fVerbose)

{
  Aig_Man_t *pAig;
  Aig_Man_t *pMan_00;
  Aig_Man_t *pTemp;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pNtkAig;
  int fVerbose_local;
  int nLeafMax_local;
  int nCutsMax_local;
  Abc_Ntk_t *pNtk_local;
  
  pAig = Abc_NtkToDar(pNtk,0,0);
  if (pAig == (Aig_Man_t *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    pMan_00 = Csw_Sweep(pAig,nCutsMax,nLeafMax,fVerbose);
    pNtk_local = Abc_NtkFromDar(pNtk,pMan_00);
    Aig_ManStop(pAig);
    Aig_ManStop(pMan_00);
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkCSweep( Abc_Ntk_t * pNtk, int nCutsMax, int nLeafMax, int fVerbose )
{
//    extern Aig_Man_t * Csw_Sweep( Aig_Man_t * pAig, int nCutsMax, int nLeafMax, int fVerbose );
    Abc_Ntk_t * pNtkAig;
    Aig_Man_t * pMan, * pTemp;
    pMan = Abc_NtkToDar( pNtk, 0, 0 );
    if ( pMan == NULL )
        return NULL;
    pMan = Csw_Sweep( pTemp = pMan, nCutsMax, nLeafMax, fVerbose );
    pNtkAig = Abc_NtkFromDar( pNtk, pMan );
    Aig_ManStop( pTemp );
    Aig_ManStop( pMan );
    return pNtkAig;
}